

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O3

BOOL __thiscall
Js::JavascriptString::DeleteProperty
          (JavascriptString *this,PropertyId propertyId,
          PropertyOperationFlags propertyOperationFlags)

{
  ScriptContext *this_00;
  BOOL BVar1;
  PropertyRecord *pPVar2;
  
  if (propertyId == 0xd1) {
    this_00 = (((((this->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
              super_JavascriptLibraryBase).scriptContext.ptr;
    pPVar2 = ScriptContext::GetPropertyName(this_00,0xd1);
    JavascriptError::ThrowCantDeleteIfStrictMode
              (propertyOperationFlags,this_00,(PCWSTR)(pPVar2 + 1));
    return 0;
  }
  BVar1 = RecyclableObject::DeleteProperty
                    (&this->super_RecyclableObject,propertyId,propertyOperationFlags);
  return BVar1;
}

Assistant:

BOOL JavascriptString::DeleteProperty(PropertyId propertyId, PropertyOperationFlags propertyOperationFlags)
    {
        if (propertyId == PropertyIds::length)
        {
            JavascriptError::ThrowCantDeleteIfStrictMode(propertyOperationFlags, this->GetScriptContext(), this->GetScriptContext()->GetPropertyName(propertyId)->GetBuffer());

            return FALSE;
        }
        return __super::DeleteProperty(propertyId, propertyOperationFlags);
    }